

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

void __thiscall
slang::ast::WaitOrderStatement::serializeTo(WaitOrderStatement *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppEVar2;
  size_t __n;
  long lVar3;
  string_view name;
  
  name._M_str = "events";
  name._M_len = 6;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->events)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->events)._M_ptr;
    lVar3 = 0;
    do {
      __n = *(size_t *)((long)ppEVar2 + lVar3);
      ASTSerializer::startObject(serializer);
      ASTSerializer::write(serializer,6,"target",__n);
      ASTSerializer::endObject(serializer);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  if (this->ifTrue != (Statement *)0x0) {
    ASTSerializer::write(serializer,6,"ifTrue",(size_t)this->ifTrue);
  }
  if (this->ifFalse != (Statement *)0x0) {
    ASTSerializer::write(serializer,7,"ifFalse",(size_t)this->ifFalse);
    return;
  }
  return;
}

Assistant:

void WaitOrderStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("events");
    for (auto ev : events) {
        serializer.startObject();
        serializer.write("target", *ev);
        serializer.endObject();
    }
    serializer.endArray();

    if (ifTrue)
        serializer.write("ifTrue", *ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
}